

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> * __thiscall
crnlib::vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator=
          (vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *this,
          vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *other)

{
  uint uVar1;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *in_RSI;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *in_RDI;
  uint i;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *pSrc;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *pDst;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *in_stack_ffffffffffffffe0;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    if (in_RDI->m_capacity < in_RSI->m_size) {
      clear((vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *)
            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      increase_capacity((vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (uint)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0),
                        SUB81((ulong)in_RDI >> 0x10,0));
    }
    else {
      resize(in_stack_ffffffffffffffe0,(uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x18,0));
    }
    for (uVar1 = in_RSI->m_size; uVar1 != 0; uVar1 = uVar1 - 1) {
      helpers::
      construct<std::pair<crnlib::vec<2u,float>,unsigned_int>,std::pair<crnlib::vec<2u,float>,unsigned_int>>
                ((pair<crnlib::vec<2U,_float>,_unsigned_int> *)
                 CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                 (pair<crnlib::vec<2U,_float>,_unsigned_int> *)in_RDI);
    }
    in_RDI->m_size = in_RSI->m_size;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

inline vector& operator=(const vector& other) {
    if (this == &other)
      return *this;

    if (m_capacity >= other.m_size)
      resize(0);
    else {
      clear();
      increase_capacity(other.m_size, false);
    }

    if (CRNLIB_IS_BITWISE_COPYABLE(T))
      memcpy(m_p, other.m_p, other.m_size * sizeof(T));
    else {
      T* pDst = m_p;
      const T* pSrc = other.m_p;
      for (uint i = other.m_size; i > 0; i--)
        helpers::construct(pDst++, *pSrc++);
    }

    m_size = other.m_size;

    return *this;
  }